

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int sftp_packet_read(LIBSSH2_SFTP *sftp)

{
  uchar uVar1;
  byte bVar2;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar3;
  LIBSSH2_SESSION *session;
  int iVar4;
  uint32_t uVar5;
  unsigned_long uVar6;
  ssize_t sVar7;
  sftp_zombie_requests *psVar8;
  list_node *entry;
  list_node *plVar9;
  size_t sVar10;
  list_head *plVar11;
  char *pcVar12;
  uint uVar13;
  list_head *plVar14;
  int iStack_50;
  
  channel = sftp->channel;
  pLVar3 = channel->session;
  if (sftp->packet_state == libssh2_NB_state_sent1) {
    sftp->packet_state = libssh2_NB_state_idle;
    plVar9 = (list_node *)sftp->partial_packet;
    if (plVar9 == (list_node *)0x0) goto LAB_001266a4;
  }
  else {
    if (sftp->packet_state != libssh2_NB_state_sent) {
LAB_001266a4:
      sVar7 = _libssh2_channel_read
                        (channel,0,(char *)(sftp->packet_header + sftp->packet_header_len),
                         9 - sftp->packet_header_len);
      if (sVar7 == -0x25) {
        return -0x25;
      }
      if (sVar7 < 0) {
        pcVar12 = "channel read";
        iStack_50 = (int)sVar7;
        goto LAB_0012691e;
      }
      sVar10 = sftp->packet_header_len + sVar7;
      sftp->packet_header_len = sVar10;
      if (sVar10 != 9) {
        return -0x25;
      }
      uVar5 = _libssh2_ntohu32(sftp->packet_header);
      sftp->partial_len = uVar5;
      uVar1 = sftp->packet_header[4];
      uVar5 = _libssh2_ntohu32(sftp->packet_header + 5);
      uVar13 = sftp->partial_len;
      if ((ulong)uVar13 < 0x40001) {
        if (4 < uVar13) goto LAB_0012688d;
        pcVar12 = "Invalid SFTP packet size";
      }
      else {
        if (((sftp->readdir_state == libssh2_NB_state_idle) || (sftp->readdir_request_id != uVar5))
           || (uVar1 != 'h')) {
          libssh2_channel_flush_ex(channel,0);
          sftp->packet_header_len = 0;
          pcVar12 = "SFTP packet too large";
          iStack_50 = -0x19;
          goto LAB_0012691e;
        }
LAB_0012688d:
        plVar9 = (list_node *)(*pLVar3->alloc)((ulong)uVar13,&pLVar3->abstract);
        if (plVar9 != (list_node *)0x0) {
          sftp->packet_header_len = 0;
          sftp->partial_packet = (uchar *)plVar9;
          sftp->partial_received = 5;
          *(uchar *)((long)&plVar9->next + 4) = sftp->packet_header[8];
          *(undefined4 *)&plVar9->next = *(undefined4 *)(sftp->packet_header + 4);
          goto LAB_00126612;
        }
        pcVar12 = "Unable to allocate SFTP packet";
      }
      iStack_50 = -6;
      goto LAB_0012691e;
    }
    sftp->packet_state = libssh2_NB_state_idle;
    plVar9 = (list_node *)sftp->partial_packet;
LAB_00126612:
    uVar6 = libssh2_channel_window_read_ex(channel,(unsigned_long *)0x0,(unsigned_long *)0x0);
    if (uVar6 < sftp->partial_len) {
      iVar4 = _libssh2_channel_receive_window_adjust
                        (channel,sftp->partial_len * 2,'\x01',(uint *)0x0);
      sftp->packet_state = (uint)(iVar4 == -0x25) * 3;
      if (iVar4 == -0x25) {
        return -0x25;
      }
    }
  }
  plVar11 = (list_head *)sftp->partial_received;
  while( true ) {
    plVar14 = (list_head *)(ulong)sftp->partial_len;
    if (plVar14 < plVar11 || (long)plVar14 - (long)plVar11 == 0) {
      sftp->partial_packet = (uchar *)0x0;
      if (sftp->partial_len < 5) {
        iVar4 = -0x29;
      }
      else {
        bVar2 = *(byte *)&plVar9->next;
        uVar13 = (uint)bVar2;
        session = sftp->channel->session;
        if (((bVar2 - 1 < 0x14) || (bVar2 - 0x65 < 5)) || (bVar2 - 200 < 2)) {
          uVar5 = _libssh2_ntohu32((uchar *)((long)&plVar9->next + 1));
          if (((*(byte *)&plVar9->next | 2) == 0x67) &&
             (psVar8 = find_zombie_request(sftp,uVar5), psVar8 != (sftp_zombie_requests *)0x0)) {
            (*session->free)(plVar9,&session->abstract);
            pLVar3 = sftp->channel->session;
            psVar8 = find_zombie_request(sftp,uVar5);
            if (psVar8 == (sftp_zombie_requests *)0x0) {
              return uVar13;
            }
            _libssh2_list_remove(&psVar8->node);
            (*pLVar3->free)(psVar8,&pLVar3->abstract);
            return uVar13;
          }
          entry = (list_node *)(*session->alloc)(0x30,&session->abstract);
          if (entry != (list_node *)0x0) {
            entry[1].prev = plVar9;
            entry[1].head = plVar14;
            *(uint32_t *)&entry[1].next = uVar5;
            _libssh2_list_add(&sftp->packets,entry);
            return uVar13;
          }
          pcVar12 = "Unable to allocate datablock for SFTP packet";
          iVar4 = -6;
        }
        else {
          sftp->last_errno = 0;
          pcVar12 = "Out of sync with the world";
          iVar4 = -0x1f;
        }
        iVar4 = _libssh2_error(session,iVar4,pcVar12);
        if (iVar4 == 0) {
          return uVar13;
        }
      }
      (*pLVar3->free)(plVar9,&pLVar3->abstract);
      return iVar4;
    }
    sVar7 = _libssh2_channel_read
                      (channel,0,(char *)((long)&plVar9->next + (long)&plVar11->last),
                       (long)plVar14 - (long)plVar11);
    if (sVar7 == -0x25) {
      sftp->packet_state = libssh2_NB_state_sent1;
      return -0x25;
    }
    if (sVar7 < 0) break;
    plVar11 = (list_head *)(sftp->partial_received + sVar7);
    sftp->partial_received = (size_t)plVar11;
  }
  (*pLVar3->free)(plVar9,&pLVar3->abstract);
  sftp->partial_packet = (uchar *)0x0;
  pcVar12 = "Error waiting for SFTP packet";
  iStack_50 = (int)sVar7;
LAB_0012691e:
  iVar4 = _libssh2_error(pLVar3,iStack_50,pcVar12);
  return iVar4;
}

Assistant:

static int
sftp_packet_read(LIBSSH2_SFTP *sftp)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *packet = NULL;
    ssize_t rc;
    unsigned long recv_window;
    int packet_type;
    uint32_t request_id;

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "recv packet"));

    switch(sftp->packet_state) {
    case libssh2_NB_state_sent: /* EAGAIN from window adjusting */
        sftp->packet_state = libssh2_NB_state_idle;

        packet = sftp->partial_packet;
        goto window_adjust;

    case libssh2_NB_state_sent1: /* EAGAIN from channel read */
        sftp->packet_state = libssh2_NB_state_idle;

        packet = sftp->partial_packet;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "partial read cont, len: %u", sftp->partial_len));
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "partial read cont, already recvd: %lu",
                       (unsigned long)sftp->partial_received));
        LIBSSH2_FALLTHROUGH();
    default:
        if(!packet) {
            /* only do this if there's not already a packet buffer allocated
               to use */

            /* each packet starts with a 32 bit length field */
            rc = _libssh2_channel_read(channel, 0,
                                       (char *)&sftp->packet_header[
                                           sftp->packet_header_len],
                                       sizeof(sftp->packet_header) -
                                       sftp->packet_header_len);
            if(rc == LIBSSH2_ERROR_EAGAIN)
                return (int)rc;
            else if(rc < 0)
                return _libssh2_error(session, (int)rc, "channel read");

            sftp->packet_header_len += rc;

            if(sftp->packet_header_len != sizeof(sftp->packet_header))
                /* we got a short read for the header part */
                return LIBSSH2_ERROR_EAGAIN;

            /* parse SFTP packet header */
            sftp->partial_len = _libssh2_ntohu32(sftp->packet_header);
            packet_type = sftp->packet_header[4];
            request_id = _libssh2_ntohu32(sftp->packet_header + 5);

            /* make sure we don't proceed if the packet size is unreasonably
               large */
            if(sftp->partial_len > LIBSSH2_SFTP_PACKET_MAXLEN &&
               /* exception: response to SSH_FXP_READDIR request */
               !(sftp->readdir_state != libssh2_NB_state_idle &&
                 sftp->readdir_request_id == request_id &&
                 packet_type == SSH_FXP_NAME)) {
                libssh2_channel_flush(channel);
                sftp->packet_header_len = 0;
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_CHANNEL_PACKET_EXCEEDED,
                                      "SFTP packet too large");
            }

            if(sftp->partial_len < 5)
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_ALLOC,
                                      "Invalid SFTP packet size");

            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "Data begin - Packet Length: %lu",
                           (unsigned long)sftp->partial_len));
            packet = LIBSSH2_ALLOC(session, sftp->partial_len);
            if(!packet)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "Unable to allocate SFTP packet");
            sftp->packet_header_len = 0;
            sftp->partial_packet = packet;
            /* copy over packet type(4) and request id(1) */
            sftp->partial_received = 5;
            memcpy(packet, sftp->packet_header + 4, 5);

window_adjust:
            recv_window = libssh2_channel_window_read_ex(channel, NULL, NULL);

            if(sftp->partial_len > recv_window) {
                /* ask for twice the data amount we need at once */
                rc = _libssh2_channel_receive_window_adjust(channel,
                                                            sftp->partial_len
                                                            * 2,
                                                            1, NULL);
                /* store the state so that we continue with the correct
                   operation at next invoke */
                sftp->packet_state = (rc == LIBSSH2_ERROR_EAGAIN)?
                    libssh2_NB_state_sent:
                    libssh2_NB_state_idle;

                if(rc == LIBSSH2_ERROR_EAGAIN)
                    return (int)rc;
            }
        }

        /* Read as much of the packet as we can */
        while(sftp->partial_len > sftp->partial_received) {
            rc = _libssh2_channel_read(channel, 0,
                                       (char *)&packet[sftp->partial_received],
                                       sftp->partial_len -
                                       sftp->partial_received);

            if(rc == LIBSSH2_ERROR_EAGAIN) {
                /*
                 * We received EAGAIN, save what we have and return EAGAIN to
                 * the caller. Set 'partial_packet' so that this function
                 * knows how to continue on the next invoke.
                 */
                sftp->packet_state = libssh2_NB_state_sent1;
                return (int)rc;
            }
            else if(rc < 0) {
                LIBSSH2_FREE(session, packet);
                sftp->partial_packet = NULL;
                return _libssh2_error(session, (int)rc,
                                      "Error waiting for SFTP packet");
            }
            sftp->partial_received += rc;
        }

        sftp->partial_packet = NULL;

        /* sftp_packet_add takes ownership of the packet and might free it
           so we take a copy of the packet type before we call it. */
        packet_type = packet[0];
        rc = sftp_packet_add(sftp, packet, sftp->partial_len);
        if(rc) {
            LIBSSH2_FREE(session, packet);
            return (int)rc;
        }
        else {
            return packet_type;
        }
    }
    /* WON'T REACH */
}